

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

char * __thiscall
kj::_::Delimited<kj::ArrayPtr<void_*const>_&>::flattenTo
          (Delimited<kj::ArrayPtr<void_*const>_&> *this,char *target,char *limit)

{
  bool bVar1;
  void **value;
  void **extraout_RDX;
  void **extraout_RDX_00;
  long lVar2;
  kj *this_00;
  CappedArray<char,_17UL> local_50;
  
  this_00 = (kj *)this->array->ptr;
  lVar2 = this->array->size_ << 3;
  bVar1 = true;
  value = (void **)limit;
  while ((lVar2 != 0 && (target != limit))) {
    if (!bVar1) {
      target = fillLimited<kj::StringPtr>(target,limit,&this->delimiter);
      value = extraout_RDX;
    }
    toCharSequence<void*const&>(&local_50,this_00,value);
    target = fillLimited<kj::CappedArray<char,17ul>>(target,limit,&local_50);
    this_00 = this_00 + 8;
    lVar2 = lVar2 + -8;
    bVar1 = false;
    value = extraout_RDX_00;
  }
  return target;
}

Assistant:

char* flattenTo(char* __restrict__ target, char* limit) {
    // This is called in the strPreallocated(). We want to avoid allocation. size() will not have
    // been called in this case, so hopefully `stringified` is still uninitialized. We will
    // stringify each item and immediately use it.
    bool first = true;
    for (auto&& elem: array) {
      if (target == limit) return target;
      if (first) {
        first = false;
      } else {
        target = fillLimited(target, limit, delimiter);
      }
      target = fillLimited(target, limit, kj::toCharSequence(elem));
    }
    return target;
  }